

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
::emplace_back<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  Tag *pTVar4;
  pointer local_30;
  pointer space;
  size_type s;
  QueueEntry *args_local;
  InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
  *this_local;
  
  sVar2 = size(this);
  sVar3 = capacity(this);
  if (sVar3 < sVar2) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>]"
                 );
  }
  sVar3 = capacity(this);
  if (sVar2 == sVar3) {
    this_local = (InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
                  *)GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>(this,args)
    ;
  }
  else {
    sVar3 = capacity(this);
    if (sVar3 <= sVar2) {
      __assert_fail("s < capacity()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                    ,0x21b,
                    "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>]"
                   );
    }
    bVar1 = allocated(this);
    if (bVar1) {
      pTVar4 = tag(this);
      Tag::set_allocated_size(pTVar4,sVar2 + 1);
      local_30 = allocated_space(this);
    }
    else {
      pTVar4 = tag(this);
      Tag::set_inline_size(pTVar4,sVar2 + 1);
      local_30 = inlined_space(this);
    }
    this_local = (InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
                  *)Construct<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>
                              (this,local_30 + sVar2,args);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }